

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void append_honorific(char *buf)

{
  int iVar1;
  char *pcVar2;
  char *buf_local;
  
  iVar1 = rn2(4);
  strcat(buf,append_honorific::honored[(int)(iVar1 + (uint)((ushort)u.uevent._0_2_ >> 0xd & 1))]);
  if (((youmonst.data)->mlet == '0') || (((youmonst.data)->mflags2 & 0x100) != 0)) {
    pcVar2 = " dark lord";
    if (flags.female != '\0') {
      pcVar2 = " dark lady";
    }
    strcat(buf,pcVar2);
  }
  else if (((youmonst.data)->mflags2 & 0x10) == 0) {
    if (((youmonst.data)->mflags2 & 8) == 0) {
      strcat(buf," creature");
    }
    else {
      pcVar2 = " sir";
      if (flags.female != '\0') {
        pcVar2 = " lady";
      }
      strcat(buf,pcVar2);
    }
  }
  else {
    pcVar2 = " hir";
    if (flags.female != '\0') {
      pcVar2 = " hiril";
    }
    strcat(buf,pcVar2);
  }
  return;
}

Assistant:

static void append_honorific(char *buf)
{
	static const char *const honored[5] = {
	    "good", "honored", "most gracious", "esteemed",
	    "most renowned and sacred"
	};
	strcat(buf, honored[rn2(4) + u.uevent.udemigod]);

	if (is_vampire(youmonst.data))
	    strcat(buf, flags.female ? " dark lady" : " dark lord");
	else if (is_elf(youmonst.data))
	    strcat(buf, flags.female ? " hiril" : " hir");
	else if (!is_human(youmonst.data))
	    strcat(buf, " creature");
	else
	    strcat(buf, flags.female ? " lady" : " sir");
}